

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_bit.c
# Opt level: O3

int lj_ffh_bit_bswap(lua_State *L)

{
  long *plVar1;
  TValue *pTVar2;
  ulong uVar3;
  uint in_EAX;
  int iVar4;
  uint64_t uVar5;
  void *pvVar6;
  CTypeID id;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  uVar5 = lj_carith_check64(L,1,(CTypeID *)((long)&uStack_28 + 4));
  uVar3 = uStack_28;
  if (uStack_28._4_4_ == 0) {
    iVar4 = 0;
  }
  else {
    pvVar6 = lj_mem_newgco(L,0x10);
    *(undefined1 *)((long)pvVar6 + 5) = 10;
    *(short *)((long)pvVar6 + 6) = (short)(uVar3 >> 0x20);
    plVar1 = (long *)((ulong)(L->glref).ptr32 + 0xe0);
    *plVar1 = *plVar1 + 1;
    *(uint64_t *)((long)pvVar6 + 8) =
         uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
         (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
         (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
    pTVar2 = L->base;
    pTVar2[-1].u32.lo = (uint32_t)pvVar6;
    *(undefined4 *)((long)pTVar2 + -4) = 0xfffffff5;
    iVar4 = 2;
  }
  return iVar4;
}

Assistant:

LJLIB_ASM(bit_bswap)		LJLIB_REC(bit_unary IR_BSWAP)
{
#if LJ_HASFFI
  CTypeID id = 0;
  uint64_t x = lj_carith_check64(L, 1, &id);
  return id ? bit_result64(L, id, lj_bswap64(x)) : FFH_RETRY;
#else
  lj_lib_checknumber(L, 1);
  return FFH_RETRY;
#endif
}